

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_BasicGroundCombatVehicle.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::GED_BasicGroundCombatVehicle
          (GED_BasicGroundCombatVehicle *this)

{
  long lVar1;
  
  GED::GED(&this->super_GED);
  (this->super_GED).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GED_BasicGroundCombatVehicle_00325730;
  this->m_ui16EntityID = 0;
  DATA_TYPE::EntityAppearance::EntityAppearance(&this->m_EA);
  this->m_i8GnElvRt = '\0';
  this->m_i8Spd = '\0';
  this->m_i8TrrtAz = '\0';
  this->m_i8GnElv = '\0';
  this->m_i8TrrtSlwRt = '\0';
  for (lVar1 = -3; lVar1 != 0; lVar1 = lVar1 + 1) {
    this->m_i16Offsets[lVar1 + 3] = 0;
    this->m_i8Ori[lVar1 + 3] = '\0';
  }
  return;
}

Assistant:

GED_BasicGroundCombatVehicle::GED_BasicGroundCombatVehicle() :
    m_ui16EntityID( 0 ),
    m_i8Spd( 0 ),
    m_i8TrrtAz( 0 ),
    m_i8GnElv( 0 ),
    m_i8TrrtSlwRt( 0 ),
    m_i8GnElvRt( 0 )
{
    for( KINT8 i = 0; i < 3; ++i )
    {
        m_i16Offsets[i] = 0;
        m_i8Ori[i] = 0;
    }
}